

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visual_studio.h
# Opt level: O3

void __thiscall bandit::failure_formatter::visual_studio::~visual_studio(visual_studio *this)

{
  operator_delete(this,8);
  return;
}

Assistant:

std::string format(const detail::assertion_exception& err) const override {
        std::stringstream ss;
        if (err.file_name().size()) {
          ss << err.file_name();

          if (err.line_number()) {
            ss << "(" << err.line_number() << ")";
          }

          ss << ": ";
        } else {
          ss << "bandit: ";
        }

        ss << err.what();

        return ss.str();
      }